

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpApiResponse.cpp
# Opt level: O1

void __thiscall xmrig::HttpApiResponse::end(HttpApiResponse *this)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  Document *this_01;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t sVar3;
  Ch *data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [32];
  char *local_b8;
  size_t local_b0;
  Data local_a8;
  void *pvStack_98;
  void *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_88;
  undefined8 local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  undefined8 local_68;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  pcVar1 = local_d8 + 0x10;
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"Access-Control-Allow-Origin","");
  paVar2 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"*","");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,&local_f8
            );
  this_00 = &(this->super_HttpResponse).m_headers;
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
              *)this_00,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.s);
  if (paStack_88 != &local_78) {
    operator_delete(paStack_88);
  }
  if (local_a8.n.i64 != (Number)&pvStack_98) {
    operator_delete((void *)local_a8.n);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"Access-Control-Allow-Methods","");
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"GET, PUT, POST, DELETE","");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,&local_f8
            );
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
              *)this_00,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.s);
  if (paStack_88 != &local_78) {
    operator_delete(paStack_88);
  }
  if (local_a8.n.i64 != (Number)&pvStack_98) {
    operator_delete((void *)local_a8.n);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  local_d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"Access-Control-Allow-Headers","");
  local_f8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"Authorization, Content-Type","");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.s,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,&local_f8
            );
  std::
  _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
            ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
              *)this_00,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a8.s);
  if (paStack_88 != &local_78) {
    operator_delete(paStack_88);
  }
  if (local_a8.n.i64 != (Number)&pvStack_98) {
    operator_delete((void *)local_a8.n);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((pointer)local_d8._0_8_ != pcVar1) {
    operator_delete((void *)local_d8._0_8_);
  }
  if (399 < (this->super_HttpResponse).m_statusCode) {
    this_01 = &this->m_doc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_a8.s,(Ch *)this_01);
    if (local_a8.n.i64 ==
        (Number)((ulong)(this->m_doc).
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        .data_.s.length * 0x20 +
                ((ulong)(this->m_doc).
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        .data_.s.str & 0xffffffffffff))) {
      local_40.s = "status";
      local_40.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<int>(&this_01->
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       ,&local_40,(this->super_HttpResponse).m_statusCode,(this->m_doc).allocator_);
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)&local_a8.s,(Ch *)this_01);
    if (local_a8.n.i64 ==
        (Number)((ulong)(this->m_doc).
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        .data_.s.length * 0x20 +
                ((ulong)(this->m_doc).
                        super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        .data_.s.str & 0xffffffffffff))) {
      local_50.s = "error";
      local_50.length = 5;
      local_60.s = http_status_str((this->super_HttpResponse).m_statusCode);
      sVar3 = strlen(local_60.s);
      local_60.length = (SizeType)sVar3;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&this_01->
                   super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ,&local_50,&local_60,(this->m_doc).allocator_);
    }
  }
  if ((this->m_doc).
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      .data_.s.length == 0) {
    HttpResponse::end(&this->super_HttpResponse,(char *)0x0,0);
  }
  else {
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"Content-Type","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"application/json","");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8.s,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
               &local_f8);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
                *)this_00,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_a8.s);
    if (paStack_88 != &local_78) {
      operator_delete(paStack_88);
    }
    if (local_a8.n.i64 != (Number)&pvStack_98) {
      operator_delete((void *)local_a8.n);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_);
    }
    local_b8 = (char *)0x0;
    local_d8._16_8_ = (void *)0x0;
    local_d8._24_8_ = 0;
    local_d8._0_8_ = (pointer)0x0;
    local_d8._8_8_ = (CrtAllocator *)0x0;
    local_b0 = 0x1000;
    local_a8.s.str = (Ch *)0x0;
    pvStack_98 = (void *)0x0;
    local_90 = (void *)0x0;
    paStack_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
    local_80 = 0;
    local_78._M_allocated_capacity = 0x200;
    local_78._12_2_ = 0x2000;
    local_68 = 0x100000004;
    local_78._8_4_ = 10;
    local_a8.n = (Number)local_d8;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
    Accept<rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>>
              ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                *)&this->m_doc,
               (PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                *)&local_a8.s);
    data = rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetString
                     ((GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)
                      local_d8);
    HttpResponse::end(&this->super_HttpResponse,data,local_d8._24_8_ - local_d8._16_8_);
    free(local_90);
    if (pvStack_98 != (void *)0x0) {
      operator_delete(pvStack_98);
    }
    free((void *)local_d8._16_8_);
    if ((CrtAllocator *)local_d8._8_8_ != (CrtAllocator *)0x0) {
      operator_delete((void *)local_d8._8_8_);
    }
  }
  return;
}

Assistant:

void xmrig::HttpApiResponse::end()
{
    using namespace rapidjson;

    setHeader("Access-Control-Allow-Origin", "*");
    setHeader("Access-Control-Allow-Methods", "GET, PUT, POST, DELETE");
    setHeader("Access-Control-Allow-Headers", "Authorization, Content-Type");

    if (statusCode() >= 400) {
        if (!m_doc.HasMember(kStatus)) {
            m_doc.AddMember(StringRef(kStatus), statusCode(), m_doc.GetAllocator());
        }

        if (!m_doc.HasMember(kError)) {
            m_doc.AddMember(StringRef(kError), StringRef(http_status_str(static_cast<http_status>(statusCode()))), m_doc.GetAllocator());
        }
    }

    if (!m_doc.MemberCount()) {
        return HttpResponse::end();
    }

    setHeader("Content-Type", "application/json");

    StringBuffer buffer(nullptr, 4096);
    PrettyWriter<StringBuffer> writer(buffer);
    writer.SetMaxDecimalPlaces(10);
    writer.SetFormatOptions(kFormatSingleLineArray);

    m_doc.Accept(writer);

    HttpResponse::end(buffer.GetString(), buffer.GetSize());
}